

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O3

dino_template_error_t
dino_template_generate_buffer
          (dino_string_ptr input_buffer,dino_string_ptr output_buffer,void *context_ptr,
          function_string_ptr_t function_string_ptr,function_boolean_ptr_t function_boolean_ptr)

{
  dino_template_error_t dVar1;
  operator_type_t oVar2;
  dino_template_error_t dVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  char *ptr_in;
  ulong uVar6;
  char *pcVar7;
  undefined1 local_90 [8];
  pi_template_generator_t ptg_context;
  _Bool local_31 [8];
  _Bool bool_value;
  
  dVar1 = dino_template_invalid_input;
  dVar3 = dino_template_invalid_input;
  if ((((input_buffer != (dino_string_ptr)0x0) &&
       (dVar3 = dVar1, output_buffer != (dino_string_ptr)0x0)) &&
      (function_string_ptr != (function_string_ptr_t)0x0)) &&
     (function_boolean_ptr != (function_boolean_ptr_t)0x0)) {
    dino_string_reset(output_buffer);
    pi_template_generator_create
              ((pi_template_generator_t *)local_90,output_buffer,context_ptr,function_boolean_ptr,
               function_string_ptr);
    __s = dino_string_c_ptr(input_buffer);
    sVar4 = dino_string_c_strlen(input_buffer);
    pcVar7 = __s + sVar4;
    if (*__s == '%') {
      dino_string_append_char(output_buffer,'%');
      __s = __s + 1;
    }
    ptg_context._72_8_ = dino_string_new();
    if (__s < pcVar7) {
      do {
        pcVar5 = strchr(__s,0x25);
        if (pcVar5 == (char *)0x0) {
          pi_template_output((pi_template_generator_t *)local_90,__s);
          break;
        }
        uVar6 = (ulong)((uint)(pcVar5[-1] != '<') * 2);
        pi_template_output_length
                  ((pi_template_generator_t *)local_90,__s,
                   (size_t)(pcVar5 + uVar6 + (-1 - (long)__s)));
        __s = pcVar5 + uVar6 + -1;
        if (pcVar5[-1] == '<') {
          local_31[0] = false;
          oVar2 = pi_template_lookup_symbol
                            ((pi_template_generator_t *)local_90,__s,
                             (dino_string_ptr)ptg_context._72_8_,local_31);
          switch(oVar2) {
          case operator_type_variable:
          case operator_type_output:
            ptr_in = dino_string_c_ptr((dino_string_ptr)ptg_context._72_8_);
            pi_template_output((pi_template_generator_t *)local_90,ptr_in);
            break;
          case operator_type_If:
            if ((long)(int)ptg_context.output_buffer < 0x20) {
              ptg_context.if_stack[(long)(int)ptg_context.output_buffer + -8] = local_31[0];
            }
            ptg_context.output_buffer._0_4_ = (int)ptg_context.output_buffer + 1;
            break;
          case operator_type_Else:
            if ((int)ptg_context.output_buffer - 1U < 0x1f) {
              ptg_context.if_stack[(ulong)((int)ptg_context.output_buffer - 1U) - 8] =
                   (_Bool)(ptg_context.if_stack[(ulong)((int)ptg_context.output_buffer - 1U) - 8] ^
                          1);
            }
            break;
          case operator_type_EndIf:
            if (0 < (int)ptg_context.output_buffer) {
              ptg_context.output_buffer._0_4_ = (int)ptg_context.output_buffer + -1;
            }
            break;
          default:
            log_message(2,"dino_template_generate_buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                        ,0x16c,"Invalid Operator Type at offset %d.",(long)pcVar7 - (long)__s);
          }
          if (*__s == '<') {
            __s = __s + (ulong)(pcVar5[uVar6] == '%') * 2;
          }
          for (; *__s != '\0'; __s = __s + 1) {
            if (*__s == '%') {
              __s = __s + (ulong)(__s[1] == '>') * 2;
              break;
            }
          }
        }
      } while (__s < pcVar7);
    }
    dino_string_delete((dino_string_ptr)ptg_context._72_8_,true);
    intmap_delete((dino_intmap_t *)ptg_context.function_boolean_ptr);
    dVar3 = dino_template_no_error;
  }
  return dVar3;
}

Assistant:

dino_template_error_t dino_template_generate_buffer(dino_string_ptr input_buffer,
                                                    dino_string_ptr output_buffer,
                                                    void *context_ptr,
                                                    function_string_ptr_t function_string_ptr,
                                                    function_boolean_ptr_t function_boolean_ptr) {
    if (NULL == function_string_ptr
        || NULL == function_boolean_ptr
        || NULL == output_buffer
        || NULL == input_buffer) {
        return dino_template_invalid_input;
    }

    dino_string_reset(output_buffer);

    pi_template_generator_t ptg_context;

    pi_template_generator_create(&ptg_context,
                                 output_buffer,
                                 context_ptr,
                                 function_boolean_ptr,
                                 function_string_ptr);

    const char *ptr_in = dino_string_c_ptr(input_buffer);
    const char *ptr_EOF = ptr_in + dino_string_c_strlen(input_buffer);

    if (*ptr_in == '%') {
        dino_string_append_char(output_buffer, *ptr_in);
        ptr_in++;
    }

    dino_string_ptr symbol_buffer = dino_string_new();

    while (ptr_in < ptr_EOF) {
        //  Look for '%' and then see if we have a "<%"
        //  Initialization would have ensured that we wont crash...
        //
        const char *ptr_tag = strchr(ptr_in, '%');
        if (!ptr_tag) {
            //  No more tags, copy the rest of the data to the output
            //  buffer and break the loop.
            //
            pi_template_output(&ptg_context, ptr_in);
            break;
        }

        //  Set the ptr_tag to the beginning of the '<%' tag...
        ptr_tag--;

        size_t length_to_append = ptr_tag - ptr_in + 2 * (*ptr_tag != '<');

        pi_template_output_length(&ptg_context, ptr_in, length_to_append);

        ptr_in += length_to_append;
        if (*ptr_tag != '<') {
            continue;
        }

        bool bool_value = false;
        operator_type_t operator_type = pi_template_lookup_symbol(&ptg_context,
                                                                  ptr_in,
                                                                  symbol_buffer,
                                                                  &bool_value);
        switch (operator_type) {
            case operator_type_invalid:
            default:
                ERROR_LOG("Invalid Operator Type at offset %d.", ptr_EOF - ptr_in);
                break;
            case operator_type_variable:
            case operator_type_output:
                pi_template_output(&ptg_context, dino_string_c_ptr(symbol_buffer));
                break;

            case operator_type_If:
                pi_template_push_if(&ptg_context, bool_value);
                break;

            case operator_type_Else:
                pi_template_push_else(&ptg_context);
                break;

            case operator_type_EndIf:
                pi_template_pop_if(&ptg_context);
                break;
        }

        // Skip over opening <%
        //
        if (*ptr_in == '<' && *(ptr_in + 1) == '%') {
            ptr_in += 2;
        }

        // Skip to closing %>
        //
        while ('%' != *ptr_in && *ptr_in) {
            ptr_in++;
        }

        if (*ptr_in == '%' && *(ptr_in + 1) == '>') {
            ptr_in += 2;
        }
    }
    dino_string_delete(symbol_buffer, true);

    pi_template_generator_destroy(&ptg_context);
    return dino_template_no_error;
}